

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O2

csp_packet_t * csp_read(csp_conn_t *conn,uint32_t timeout)

{
  uint uVar1;
  uint32_t timeout_00;
  int iVar2;
  csp_packet_t *packet;
  csp_packet_t *local_10;
  
  local_10 = (csp_packet_t *)0x0;
  if (conn != (csp_conn_t *)0x0) {
    if (conn->state != 1) {
      return (csp_packet_t *)0x0;
    }
    timeout_00 = 0;
    if (((timeout != 0) && (timeout_00 = timeout, ((conn->idin).flags & 2) != 0)) &&
       (uVar1 = (conn->rdp).conn_timeout, timeout < uVar1)) {
      timeout_00 = uVar1;
    }
    iVar2 = csp_queue_dequeue(conn->rx_queue,&local_10,timeout_00);
    if (iVar2 == 0) {
      if (((conn->idin).flags & 2) == 0) {
        return local_10;
      }
      if ((conn->rdp).delayed_acks == 0) {
        return local_10;
      }
      csp_rdp_check_ack(conn);
      return local_10;
    }
  }
  return (csp_packet_t *)0x0;
}

Assistant:

csp_packet_t * csp_read(csp_conn_t * conn, uint32_t timeout) {

	csp_packet_t * packet = NULL;

	if ((conn == NULL) || (conn->state != CONN_OPEN)) {
		return NULL;
	}

#if (CSP_USE_RDP)
	// RDP: timeout can either be 0 (for no hang poll/check) or minimum the "connection timeout"
	if (timeout && (conn->idin.flags & CSP_FRDP) && (timeout < conn->rdp.conn_timeout)) {
		timeout = conn->rdp.conn_timeout;
	}
#endif

	if (csp_queue_dequeue(conn->rx_queue, &packet, timeout) != CSP_QUEUE_OK) {
		return NULL;
	}

#if (CSP_USE_RDP)
	/* Packet read could trigger ACK transmission */
	if ((conn->idin.flags & CSP_FRDP) && conn->rdp.delayed_acks) {
		csp_rdp_check_ack(conn);
	}
#endif

	return packet;
}